

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

format_arg * __thiscall
fmt::v5::internal::
context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
::get_arg(format_arg *__return_storage_ptr__,
         context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
         *this,uint arg_id)

{
  bool bVar1;
  
  bVar1 = basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>::check_arg_id
                    (&this->parse_context_,arg_id);
  if (bVar1) {
    do_get_arg(__return_storage_ptr__,this,arg_id);
  }
  else {
    (__return_storage_ptr__->value_).field_0.int_value = 0;
    __return_storage_ptr__->type_ = none_type;
  }
  return __return_storage_ptr__;
}

Assistant:

format_arg get_arg(unsigned arg_id) {
    return this->parse_context().check_arg_id(arg_id) ?
      this->do_get_arg(arg_id) : format_arg();
  }